

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment_uri.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_14e75::FragmentURITest_ParseRangeEmpty_Test::
~FragmentURITest_ParseRangeEmpty_Test(FragmentURITest_ParseRangeEmpty_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(FragmentURITest, ParseRangeEmpty) {
    EXPECT_EQ(ktx::parseFragmentURI("m=").mip, ktx::SelectorRange(ktx::all));
    EXPECT_EQ(ktx::parseFragmentURI("a=").stratal, ktx::SelectorRange(ktx::all));
    EXPECT_EQ(ktx::parseFragmentURI("f=").facial, ktx::SelectorRange(ktx::all));

    EXPECT_EQ(ktx::parseFragmentURI("m=,").mip, ktx::SelectorRange(ktx::all));
    EXPECT_EQ(ktx::parseFragmentURI("a=,").stratal, ktx::SelectorRange(ktx::all));
    EXPECT_EQ(ktx::parseFragmentURI("f=,").facial, ktx::SelectorRange(ktx::all));
}